

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

void __thiscall
QGles2CommandBuffer::QGles2CommandBuffer(QGles2CommandBuffer *this,QRhiImplementation *rhi)

{
  QRhiCommandBuffer::QRhiCommandBuffer(&this->super_QRhiCommandBuffer,rhi);
  (this->super_QRhiCommandBuffer).super_QRhiResource._vptr_QRhiResource =
       (_func_int **)&PTR__QGles2CommandBuffer_007dec78;
  (this->commands).v = (Command *)0x0;
  (this->commands).a = 0;
  (this->commands).p = 0;
  (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.a = 8;
  (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.s = 0;
  (this->passResTrackers).super_QVLABase<QRhiPassResourceTracker>.super_QVLABaseBase.ptr =
       &(this->passResTrackers).super_QVLAStorage<16UL,_8UL,_8LL>;
  this->lastGpuTime = 0.0;
  this->currentTarget = (QRhiRenderTarget *)0x0;
  (this->graphicsPassState).valid = false;
  (this->graphicsPassState).dynamic.stencilRef = 0;
  (this->computePassState).writtenResources.d = (Data *)0x0;
  (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.a = 4;
  (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.s = 0;
  (this->dataRetainPool).super_QVLABase<QByteArray>.super_QVLABaseBase.ptr =
       &(this->dataRetainPool).super_QVLAStorage<24UL,_8UL,_4LL>;
  (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.a = 4;
  (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.s = 0;
  (this->bufferDataRetainPool).super_QVLABase<QRhiBufferData>.super_QVLABaseBase.ptr =
       &(this->bufferDataRetainPool).super_QVLAStorage<8UL,_8UL,_4LL>;
  (this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.a = 4;
  (this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.s = 0;
  (this->imageRetainPool).super_QVLABase<QImage>.super_QVLABaseBase.ptr =
       &(this->imageRetainPool).super_QVLAStorage<24UL,_8UL,_4LL>;
  this->recordingPass = NoPass;
  this->passNeedsResourceTracking = true;
  resetCommands(this);
  this->currentPipelineGeneration = 0;
  this->currentGraphicsPipeline = (QRhiGraphicsPipeline *)0x0;
  this->currentComputePipeline = (QRhiComputePipeline *)0x0;
  this->currentGraphicsSrb = (QRhiShaderResourceBindings *)0x0;
  this->currentComputeSrb = (QRhiShaderResourceBindings *)0x0;
  *(undefined8 *)((long)&this->currentComputeSrb + 5) = 0;
  QHash<QRhiResource_*,_std::pair<int,_bool>_>::clear(&(this->computePassState).writtenResources);
  memset(this->textureUnitState,0,0x100);
  return;
}

Assistant:

QGles2CommandBuffer::QGles2CommandBuffer(QRhiImplementation *rhi)
    : QRhiCommandBuffer(rhi)
{
    resetState();
}